

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Try<int> * __thiscall
async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::tryResult
          (LazyPromise<std::pair<std::error_code,_unsigned_long>_> *this)

{
  bool bVar1;
  pair<std::error_code,_unsigned_long> *value;
  Try<int> *in_RDI;
  exception_ptr *in_stack_ffffffffffffffb8;
  Try<int> *in_stack_ffffffffffffffc0;
  Try<int> *this_00;
  Try<int> local_18;
  
  bVar1 = std::
          holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_int,_std::__exception_ptr::exception_ptr> *)0x19a1ae);
  if (bVar1) {
    std::
    get<std::__exception_ptr::exception_ptr,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
              ((variant<std::monostate,_int,_std::__exception_ptr::exception_ptr> *)0x19a1c2);
    this_00 = &local_18;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_00,in_stack_ffffffffffffffb8);
    Try<std::pair<std::error_code,_unsigned_long>_>::Try(this_00,in_stack_ffffffffffffffb8);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_00);
  }
  else {
    value = std::
            get<std::pair<std::error_code,unsigned_long>,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_int,_std::__exception_ptr::exception_ptr> *)0x19a208
                      );
    Try<std::pair<std::error_code,_unsigned_long>_>::Try<std::pair<std::error_code,_unsigned_long>_>
              (in_stack_ffffffffffffffc0,value);
  }
  return in_RDI;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }